

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

int Dau_DsdPerformReplace(char *pBuffer,int PosStart,int Pos,int Symb,char *pNext)

{
  int iVar1;
  int local_38;
  int RetValue;
  int k;
  int i;
  char *pCur;
  char *pNext_local;
  int Symb_local;
  int Pos_local;
  int PosStart_local;
  char *pBuffer_local;
  
  _k = Dau_DsdPerformReplace::pTemp;
  for (RetValue = PosStart; RetValue < Pos; RetValue = RetValue + 1) {
    if (pBuffer[RetValue] == Symb) {
      for (local_38 = 0; pNext[local_38] != '\0'; local_38 = local_38 + 1) {
        *_k = pNext[local_38];
        _k = _k + 1;
      }
    }
    else {
      *_k = pBuffer[RetValue];
      _k = _k + 1;
    }
  }
  iVar1 = PosStart + (int)_k + -0x1205c10;
  for (RetValue = PosStart; RetValue < iVar1; RetValue = RetValue + 1) {
    pBuffer[RetValue] = Dau_DsdPerformReplace::pTemp[RetValue - PosStart];
  }
  return iVar1;
}

Assistant:

static inline int Dau_DsdPerformReplace( char * pBuffer, int PosStart, int Pos, int Symb, char * pNext )
{
    static char pTemp[DAU_MAX_STR];
    char * pCur = pTemp;
    int i, k, RetValue;
    for ( i = PosStart; i < Pos; i++ )
        if ( pBuffer[i] != Symb )
            *pCur++ = pBuffer[i];
        else
            for ( k = 0; pNext[k]; k++ )
                *pCur++ = pNext[k];
    RetValue = PosStart + (pCur - pTemp);
    for ( i = PosStart; i < RetValue; i++ )
        pBuffer[i] = pTemp[i-PosStart];
    return RetValue;
}